

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UnicodeString *left,UnicodeString *right,UErrorCode *errorCode)

{
  short sVar1;
  UCollationResult UVar2;
  char16_t *left_00;
  char16_t *right_00;
  int32_t leftLength;
  int32_t rightLength;
  
  if (U_ZERO_ERROR < *errorCode) {
    return UCOL_EQUAL;
  }
  left_00 = UnicodeString::getBuffer(left);
  sVar1 = (left->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    leftLength = (left->fUnion).fFields.fLength;
  }
  else {
    leftLength = (int)sVar1 >> 5;
  }
  right_00 = UnicodeString::getBuffer(right);
  sVar1 = (right->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    rightLength = (right->fUnion).fFields.fLength;
  }
  else {
    rightLength = (int)sVar1 >> 5;
  }
  UVar2 = doCompare(this,left_00,leftLength,right_00,rightLength,errorCode);
  return UVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }